

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void MOJOSHADER_glSetPixelShaderUniformI(uint idx,int *data,uint ivec4n)

{
  MOJOSHADER_glContext *pMVar1;
  uint uVar2;
  
  pMVar1 = ctx;
  if (idx < 0x7ff) {
    uVar2 = 0x7ff - idx;
    if (ivec4n <= 0x7ff - idx) {
      uVar2 = ivec4n;
    }
    memcpy(ctx->ps_reg_file_i + (idx << 2),data,(ulong)(uVar2 << 4));
    pMVar1->generation = pMVar1->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetPixelShaderUniformI(unsigned int idx, const int *data,
                                         unsigned int ivec4n)
{
    const uint maxregs = STATICARRAYLEN(ctx->ps_reg_file_i) / 4;
    if (idx < maxregs)
    {
        assert(sizeof (GLint) == sizeof (int));
        const uint cpy = (minuint(maxregs - idx, ivec4n) * sizeof (*data)) * 4;
        memcpy(ctx->ps_reg_file_i + (idx * 4), data, cpy);
        ctx->generation++;
    } // if
}